

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O1

void __thiscall Assimp::OptimizeGraphProcess::Execute(OptimizeGraphProcess *this,aiScene *pScene)

{
  LockedSetType *this_00;
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  aiNodeAnim *paVar4;
  aiBone *paVar5;
  aiCamera *paVar6;
  aiLight *paVar7;
  aiNode *paVar8;
  pointer puVar9;
  _List_node_base *p_Var10;
  uint uVar11;
  bool bVar12;
  Logger *pLVar13;
  aiAnimation *paVar14;
  size_t sVar15;
  aiMesh *paVar16;
  aiNode *this_01;
  aiNode **ppaVar17;
  runtime_error *this_02;
  ulong uVar18;
  _List_node_base *p_Var19;
  ulong uVar20;
  list<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  aiString prev;
  _List_node_base local_5e8;
  long local_5d8;
  char *local_5d0;
  char local_5c0 [16];
  undefined1 local_5b0 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  
  pLVar13 = DefaultLogger::get();
  Logger::debug(pLVar13,"OptimizeGraphProcess begin");
  this->count_merged = 0;
  this->nodes_in = 0;
  this->nodes_out = 0;
  this->mScene = pScene;
  local_438[0]._M_dataplus._M_p = (pointer)((ulong)local_438[0]._M_dataplus._M_p._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->meshes,(ulong)pScene->mNumMeshes,(value_type_conflict1 *)local_438);
  FindInstancedMeshes(this,pScene->mRootNode);
  this_00 = &this->locked;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this_00->_M_t);
  for (p_Var19 = (this->locked_nodes).
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      p_Var19 != (_List_node_base *)&this->locked_nodes; p_Var19 = p_Var19->_M_next) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var19 + 1));
  }
  if (pScene->mNumAnimations != 0) {
    uVar20 = 0;
    do {
      paVar14 = pScene->mAnimations[uVar20];
      if (paVar14->mNumChannels != 0) {
        uVar18 = 0;
        do {
          paVar4 = paVar14->mChannels[uVar18];
          pcVar1 = (paVar4->mNodeName).data;
          local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
          sVar15 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,pcVar1,(paVar4->mNodeName).data + sVar15);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
            operator_delete(local_438[0]._M_dataplus._M_p);
          }
          uVar18 = uVar18 + 1;
          paVar14 = pScene->mAnimations[uVar20];
        } while (uVar18 < paVar14->mNumChannels);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < pScene->mNumAnimations);
  }
  if (pScene->mNumMeshes != 0) {
    uVar20 = 0;
    do {
      paVar16 = pScene->mMeshes[uVar20];
      if (paVar16->mNumBones != 0) {
        uVar18 = 0;
        do {
          paVar5 = paVar16->mBones[uVar18];
          pcVar1 = (paVar5->mName).data;
          local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
          sVar15 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,pcVar1,(paVar5->mName).data + sVar15);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
            operator_delete(local_438[0]._M_dataplus._M_p);
          }
          puVar9 = (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar20;
          *puVar9 = *puVar9 + 2;
          uVar18 = uVar18 + 1;
          paVar16 = pScene->mMeshes[uVar20];
        } while (uVar18 < paVar16->mNumBones);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < pScene->mNumMeshes);
  }
  if (pScene->mNumCameras != 0) {
    uVar20 = 0;
    do {
      paVar6 = pScene->mCameras[uVar20];
      pcVar1 = (paVar6->mName).data;
      local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
      sVar15 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,pcVar1,(paVar6->mName).data + sVar15);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
        operator_delete(local_438[0]._M_dataplus._M_p);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < pScene->mNumCameras);
  }
  if (pScene->mNumLights != 0) {
    uVar20 = 0;
    do {
      paVar7 = pScene->mLights[uVar20];
      pcVar1 = (paVar7->mName).data;
      local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
      sVar15 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,pcVar1,(paVar7->mName).data + sVar15);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
        operator_delete(local_438[0]._M_dataplus._M_p);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < pScene->mNumLights);
  }
  this_01 = (aiNode *)operator_new(0x478);
  paVar2 = &local_438[0].field_2;
  local_438[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"$Reserved_And_Evil","");
  aiNode::aiNode(this_01,local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_438[0]._M_dataplus._M_p);
  }
  pcVar1 = (this_01->mName).data;
  local_438[0]._M_dataplus._M_p = (pointer)paVar2;
  sVar15 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_438,pcVar1,(this_01->mName).data + sVar15);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_438[0]._M_dataplus._M_p);
  }
  paVar8 = pScene->mRootNode;
  uVar3 = (paVar8->mName).length;
  uVar11 = 0x3ff;
  if (uVar3 < 0x3ff) {
    uVar11 = uVar3;
  }
  uVar20 = (ulong)uVar11;
  local_438[0]._M_dataplus._M_p._0_4_ = uVar11;
  memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),(paVar8->mName).data,uVar20);
  *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + uVar20 + 4) = 0;
  paVar8->mParent = this_01;
  this_01->mNumChildren = 1;
  ppaVar17 = (aiNode **)operator_new__(8);
  this_01->mChildren = ppaVar17;
  *ppaVar17 = pScene->mRootNode;
  local_5d8 = 0;
  local_5e8._M_next = &local_5e8;
  local_5e8._M_prev = &local_5e8;
  CollectNewChildren(this,this_01,(list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_5e8);
  if (local_5d8 != 1) {
    __assert_fail("nodes.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/OptimizeGraph.cpp"
                  ,0x131,"virtual void Assimp::OptimizeGraphProcess::Execute(aiScene *)");
  }
  if (this_01->mNumChildren == 1) {
    ppaVar17 = this_01->mChildren;
    pScene->mRootNode = *ppaVar17;
    *ppaVar17 = (aiNode *)0x0;
    aiNode::~aiNode(this_01);
    operator_delete(this_01);
  }
  else {
    if (this_01->mNumChildren == 0) {
      pScene->mRootNode = (aiNode *)0x0;
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_5b0._0_8_ = local_5b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5b0,"After optimizing the scene graph, no data remains","");
      std::runtime_error::runtime_error(this_02,(string *)local_5b0);
      *(undefined ***)this_02 = &PTR__runtime_error_0081d260;
      __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pScene->mRootNode = this_01;
    (this_01->mName).length = uVar11;
    memcpy(pcVar1,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),uVar20);
    (this_01->mName).data[uVar20] = '\0';
  }
  pScene->mRootNode->mParent = (aiNode *)0x0;
  bVar12 = DefaultLogger::isNullLogger();
  if (!bVar12) {
    if (this->nodes_in == this->nodes_out) {
      pLVar13 = DefaultLogger::get();
      Logger::debug(pLVar13,"OptimizeGraphProcess finished");
    }
    else {
      pLVar13 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[45]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
                 (char (*) [45])"OptimizeGraphProcess finished; Input nodes: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,", Output nodes: ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar13,local_5d0);
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base((ios_base *)(local_5b0 + 0x70));
    }
  }
  puVar9 = (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar9) {
    (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar9;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this_00->_M_t);
  p_Var19 = local_5e8._M_next;
  while (p_Var19 != &local_5e8) {
    p_Var10 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var19->_M_next)->_M_impl).
              _M_node.super__List_node_base._M_next;
    operator_delete(p_Var19);
    p_Var19 = p_Var10;
  }
  return;
}

Assistant:

void OptimizeGraphProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("OptimizeGraphProcess begin");
    nodes_in = nodes_out = count_merged = 0;
    mScene = pScene;

    meshes.resize(pScene->mNumMeshes,0);
    FindInstancedMeshes(pScene->mRootNode);

    // build a blacklist of identifiers. If the name of a node matches one of these, we won't touch it
    locked.clear();
    for (std::list<std::string>::const_iterator it = locked_nodes.begin(); it != locked_nodes.end(); ++it) {
#ifdef AI_OG_USE_HASHING
        locked.insert(SuperFastHash((*it).c_str()));
#else
        locked.insert(*it);
#endif
    }

    for (unsigned int i = 0; i < pScene->mNumAnimations; ++i) {
        for (unsigned int a = 0; a < pScene->mAnimations[i]->mNumChannels; ++a) {
            aiNodeAnim* anim = pScene->mAnimations[i]->mChannels[a];
            locked.insert(AI_OG_GETKEY(anim->mNodeName));
        }
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        for (unsigned int a = 0; a < pScene->mMeshes[i]->mNumBones; ++a) {

            aiBone* bone = pScene->mMeshes[i]->mBones[a];
            locked.insert(AI_OG_GETKEY(bone->mName));

            // HACK: Meshes referencing bones may not be transformed; we need to look them.
            // The easiest way to do this is to increase their reference counters ...
            meshes[i] += 2;
        }
    }

    for (unsigned int i = 0; i < pScene->mNumCameras; ++i) {
        aiCamera* cam = pScene->mCameras[i];
        locked.insert(AI_OG_GETKEY(cam->mName));
    }

    for (unsigned int i = 0; i < pScene->mNumLights; ++i) {
        aiLight* lgh = pScene->mLights[i];
        locked.insert(AI_OG_GETKEY(lgh->mName));
    }

    // Insert a dummy master node and make it read-only
    aiNode* dummy_root = new aiNode(AI_RESERVED_NODE_NAME);
    locked.insert(AI_OG_GETKEY(dummy_root->mName));

    const aiString prev = pScene->mRootNode->mName;
    pScene->mRootNode->mParent = dummy_root;

    dummy_root->mChildren = new aiNode*[dummy_root->mNumChildren = 1];
    dummy_root->mChildren[0] = pScene->mRootNode;

    // Do our recursive processing of scenegraph nodes. For each node collect
    // a fully new list of children and allow their children to place themselves
    // on the same hierarchy layer as their parents.
    std::list<aiNode*> nodes;
    CollectNewChildren (dummy_root,nodes);

    ai_assert(nodes.size() == 1);

    if (dummy_root->mNumChildren == 0) {
        pScene->mRootNode = NULL;
        throw DeadlyImportError("After optimizing the scene graph, no data remains");
    }

    if (dummy_root->mNumChildren > 1) {
        pScene->mRootNode = dummy_root;

        // Keep the dummy node but assign the name of the old root node to it
        pScene->mRootNode->mName = prev;
    }
    else {

        // Remove the dummy root node again.
        pScene->mRootNode = dummy_root->mChildren[0];

        dummy_root->mChildren[0] = NULL;
        delete dummy_root;
    }

    pScene->mRootNode->mParent = NULL;
    if (!DefaultLogger::isNullLogger()) {
        if ( nodes_in != nodes_out) {
            ASSIMP_LOG_INFO_F("OptimizeGraphProcess finished; Input nodes: ", nodes_in, ", Output nodes: ", nodes_out);
        } else {
            ASSIMP_LOG_DEBUG("OptimizeGraphProcess finished");
        }
    }
    meshes.clear();
    locked.clear();
}